

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall soul::heart::Block::Block(Block *this,Identifier nm)

{
  int line;
  char *location;
  char *message;
  
  (this->super_Object).location.sourceCode.object = (SourceCodeText *)0x0;
  (this->super_Object).location.location.data = (char *)0x0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Block_002fae50;
  (this->name).name = nm.name;
  (this->parameters).
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parameters).
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->statements).firstObject = (Statement *)0x0;
  (this->terminator).object = (Terminator *)0x0;
  (this->predecessors).
  super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->predecessors).
  super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->predecessors).
  super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->doNotOptimiseAway = false;
  if (nm.name == (string *)0x0) {
    line = 0x23;
    location = "toString";
    message = "isValid()";
  }
  else {
    if (*((nm.name)->_M_dataplus)._M_p == '@') {
      return;
    }
    line = 0x401;
    location = "Block";
    message = "nm.toString()[0] == \'@\'";
  }
  throwInternalCompilerError(message,location,line);
}

Assistant:

Block (Identifier nm) : name (nm)  { SOUL_ASSERT (nm.toString()[0] == '@'); }